

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::IPCFrame_InvokeMethodReply::IPCFrame_InvokeMethodReply
          (IPCFrame_InvokeMethodReply *this)

{
  IPCFrame_InvokeMethodReply *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__IPCFrame_InvokeMethodReply_009c37c0;
  this->success_ = false;
  this->has_more_ = false;
  ::std::__cxx11::string::string((string *)&this->reply_proto_);
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<4UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

IPCFrame_InvokeMethodReply::IPCFrame_InvokeMethodReply() = default;